

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O1

void TTD::NSSnapValues::AssertSnapEquiv
               (SlotArrayInfo *sai1,SlotArrayInfo *sai2,TTDCompareMap *compareMap)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  bool condition;
  PathEntry local_40;
  
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->ScriptContextLogId == sai2->ScriptContextLogId);
  TTDCompareMap::DiagnosticAssert
            (compareMap,sai1->isFunctionBodyMetaData == sai2->isFunctionBodyMetaData);
  if (sai1->isFunctionBodyMetaData == true) {
    TTDCompareMap::CheckConsistentAndAddPtrIdMapping_FunctionBody
              (compareMap,sai1->OptFunctionBodyId,sai2->OptFunctionBodyId);
  }
  TTDCompareMap::DiagnosticAssert(compareMap,sai1->SlotCount == sai2->SlotCount);
  uVar3 = (ulong)sai1->SlotCount;
  if (sai1->SlotCount != 0) {
    uVar6 = 0;
    do {
      uVar2 = (uint)uVar3;
      if (sai1->PIDArray[uVar6] == *sai2->PIDArray) {
        condition = true;
        lVar5 = 0;
      }
      else {
        lVar4 = 0;
        do {
          if (uVar2 + (uVar2 == 0) + -1 == (int)lVar4) {
            condition = (int)lVar4 + 1U < uVar2;
            goto LAB_0093c522;
          }
          lVar5 = lVar4 + 1;
          lVar1 = lVar4 + 1;
          lVar4 = lVar5;
        } while (sai1->PIDArray[uVar6] != sai2->PIDArray[lVar1]);
        condition = (uint)lVar5 < uVar2;
      }
      local_40.OptName = (char16 *)0x0;
      local_40.IndexOrPID = uVar6;
      AssertSnapEquivTTDVar_Helper
                (sai1->Slots[uVar6],sai2->Slots[lVar5],compareMap,SlotArray,&local_40);
LAB_0093c522:
      TTDCompareMap::DiagnosticAssert(compareMap,condition);
      uVar6 = uVar6 + 1;
      uVar3 = (ulong)sai1->SlotCount;
    } while (uVar6 < uVar3);
  }
  return;
}

Assistant:

void AssertSnapEquiv(const SlotArrayInfo* sai1, const SlotArrayInfo* sai2, TTDCompareMap& compareMap)
        {
            compareMap.DiagnosticAssert(sai1->ScriptContextLogId == sai2->ScriptContextLogId);

            compareMap.DiagnosticAssert(sai1->isFunctionBodyMetaData == sai2->isFunctionBodyMetaData);
            if(sai1->isFunctionBodyMetaData)
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_FunctionBody(sai1->OptFunctionBodyId, sai2->OptFunctionBodyId);
            }
            else
            {
                //TODO: emit debugger scope metadata
            }

            compareMap.DiagnosticAssert(sai1->SlotCount == sai2->SlotCount);
            for(uint32 i = 0; i < sai1->SlotCount; ++i)
            {
                Js::PropertyId id1 = sai1->PIDArray[i];
                bool found = false;
                for(uint32 j = 0; j < sai1->SlotCount; ++j)
                {
                    if(id1 == sai2->PIDArray[j])
                    {
                        AssertSnapEquivTTDVar_SlotArray(sai1->Slots[i], sai2->Slots[j], compareMap, i);
                        found = true;
                        break;
                    }
                }
                //TODO: We see this hit in a case where record has all values in a slot array when replaying --replay-debug (but not --replay).
                //      In the debug version the propertyId is in a Js::DebuggerScopeProperty instead. So this needs to be investigated in both extract and inflate.
                compareMap.DiagnosticAssert(found);
            }
        }